

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
::operator()(impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  bool bVar1;
  PyObject *pPVar2;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  object_base local_40;
  PyTypeObject *local_38;
  PyObject *local_30;
  arg_lvalue_from_python_base local_28;
  undefined4 local_1c;
  
  converter::reference_arg_from_python<PythonModuleClient_&>::reference_arg_from_python
            ((reference_arg_from_python<PythonModuleClient_&> *)&local_28,
             (PyObject *)args_[1].ob_type);
  if (local_28.m_result != (void *)0x0) {
    local_30 = (PyObject *)args_[2].ob_refcnt;
    bVar1 = converter::pyobject_type<boost::python::str,_&PyUnicode_Type>::check(local_30);
    if (bVar1) {
      local_38 = args_[2].ob_type;
      bVar1 = converter::pyobject_type<boost::python::str,_&PyUnicode_Type>::check
                        ((PyObject *)local_38);
      if (bVar1) {
        local_40.m_ptr = (PyObject *)args_[3].ob_refcnt;
        (local_40.m_ptr)->ob_refcnt = (local_40.m_ptr)->ob_refcnt + 1;
        bVar1 = converter::pyobject_type<boost::python::list,_&PyList_Type>::check(local_40.m_ptr);
        if (bVar1) {
          local_1c = 0;
          pPVar2 = invoke<int,void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::list&>>
                             (&local_1c,this,&local_28,&local_30,&local_38,&local_40);
        }
        else {
          pPVar2 = (PyObject *)0x0;
        }
        api::object_base::~object_base(&local_40);
        return pPVar2;
      }
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }